

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMPSIO.cpp
# Opt level: O2

int writeMPS_sparse(char *filename,int *numRow,int *numCol,int *objSense,double *objOffset,
                   vector<int,_std::allocator<int>_> *Astart,
                   vector<int,_std::allocator<int>_> *Aindex,
                   vector<double,_std::allocator<double>_> *Avalue,
                   vector<double,_std::allocator<double>_> *rhs,
                   vector<double,_std::allocator<double>_> *cost,
                   vector<double,_std::allocator<double>_> *lb,
                   vector<double,_std::allocator<double>_> *ub,
                   vector<int,_std::allocator<int>_> *integerColumn)

{
  double dVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  int iVar5;
  ulong uVar6;
  double *pdVar7;
  ulong uVar8;
  double *objOffset_00;
  vector<double,_std::allocator<double>_> colLower;
  vector<double,_std::allocator<double>_> colCost;
  vector<double,_std::allocator<double>_> rowUpper;
  vector<double,_std::allocator<double>_> rowLower;
  vector<double,_std::allocator<double>_> colUpper;
  
  colCost.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  colLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  colCost.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  colCost.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  colUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  colLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  colLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  rowLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  colUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  colUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  rowUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  rowLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  rowLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  rowUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  rowUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  printf("writeMPS_sparse: Model has %d rows, %d columns and  nonzeros\n",(ulong)(uint)*numRow,
         (ulong)(uint)*numCol);
  std::ostream::flush();
  std::vector<double,_std::allocator<double>_>::resize(&colCost,(long)*numCol);
  std::vector<double,_std::allocator<double>_>::resize(&colLower,(long)*numCol);
  std::vector<double,_std::allocator<double>_>::resize(&colUpper,(long)*numCol);
  std::vector<double,_std::allocator<double>_>::resize(&rowLower,(long)*numRow);
  std::vector<double,_std::allocator<double>_>::resize(&rowUpper,(long)*numRow);
  pdVar2 = (cost->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (lb->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  pdVar4 = (ub->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  objOffset_00 = (double *)0x0;
  pdVar7 = (double *)(ulong)(uint)*numCol;
  if (*numCol < 1) {
    pdVar7 = objOffset_00;
  }
  for (; pdVar7 != objOffset_00; objOffset_00 = (double *)((long)objOffset_00 + 1)) {
    colCost.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[(long)objOffset_00] = pdVar2[(long)objOffset_00];
    colLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[(long)objOffset_00] = pdVar3[(long)objOffset_00];
    colUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[(long)objOffset_00] = pdVar4[(long)objOffset_00];
  }
  pdVar2 = (rhs->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar8 = 0;
  uVar6 = (ulong)(uint)*numRow;
  if (*numRow < 1) {
    uVar6 = uVar8;
  }
  for (; uVar6 != uVar8; uVar8 = uVar8 + 1) {
    dVar1 = pdVar2[uVar8];
    rowLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar8] = dVar1;
    rowUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar8] = dVar1;
  }
  iVar5 = writeMPS(filename,numRow,numCol,(int *)pdVar2,objOffset_00,Astart,Aindex,Avalue,&colCost,
                   &colLower,&colUpper,&rowLower,&rowUpper,integerColumn);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&rowUpper.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&rowLower.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&colUpper.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&colLower.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&colCost.super__Vector_base<double,_std::allocator<double>_>);
  return iVar5;
}

Assistant:

int writeMPS_sparse(const char *filename, int& numRow, int& numCol, int& objSense, double& objOffset,
		    vector<int>& Astart, vector<int>& Aindex, vector<double>& Avalue,
		    vector<double>& rhs, vector<double>& cost, vector<double>& lb, vector<double>& ub,
		    vector<int>& integerColumn) {
  vector<double> colCost;
  vector<double> colLower;
  vector<double> colUpper;
  vector<double> rowLower;
  vector<double> rowUpper;

#ifdef JAJH_dev
  printf("writeMPS_sparse: Model has %d rows, %d columns and  nonzeros\n", numRow, numCol);//, Astart[numCol]);
  cout<<flush;
#endif
  colCost.resize(numCol);
  colLower.resize(numCol);
  colUpper.resize(numCol);
  rowLower.resize(numRow);
  rowUpper.resize(numRow);

  for (int c_n = 0; c_n<numCol; c_n++) {
    colCost[c_n] = cost[c_n];
    colLower[c_n] = lb[c_n];
    colUpper[c_n] = ub[c_n];
  }
  for (int r_n = 0; r_n<numRow; r_n++) {
    rowLower[r_n] = rhs[r_n];
    rowUpper[r_n] = rhs[r_n];
  }  
  int rtCd = writeMPS(filename, numRow, numCol, objSense, objOffset,
		      Astart,  Aindex, Avalue,
		      colCost, colLower, colUpper,
		      rowLower, rowUpper,
		      integerColumn);
  return rtCd;
}